

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

Gia_Man_t * Bmc_SuperBuildTents(Gia_Man_t *p,Vec_Int_t **pvMap)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  Vec_Int_t *p_06;
  Vec_Int_t *p_07;
  Vec_Int_t *p_08;
  Vec_Int_t *p_09;
  Vec_Int_t *p_10;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p_11;
  char *pcVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_a0;
  int iThis;
  int iPrev;
  int Rank;
  int Entry;
  int r;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vMap;
  Vec_Int_t *vRankCuts;
  Vec_Int_t *vRankIns;
  Vec_Int_t *vLimObjs;
  Vec_Int_t *vLimFlops;
  Vec_Int_t *vLimCuts;
  Vec_Int_t *vLimIns;
  Vec_Int_t *vObjs;
  Vec_Int_t *vFlops;
  Vec_Int_t *vCuts;
  Vec_Int_t *vIns;
  Vec_Int_t **pvMap_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntAlloc(1000);
  p_02 = Vec_IntAlloc(1000);
  p_03 = Vec_IntAlloc(1000);
  p_04 = Vec_IntAlloc(1000);
  p_05 = Vec_IntAlloc(1000);
  p_06 = Vec_IntAlloc(1000);
  p_07 = Vec_IntAlloc(1000);
  p_08 = Vec_IntAlloc(1000);
  p_09 = Vec_IntAlloc(1000);
  p_10 = Vec_IntAlloc(1000);
  local_a0 = 0;
  Entry = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar7 = false;
    if (Entry < iVar1) {
      _r = Gia_ManCo(p,Entry);
      bVar7 = _r != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjId(p,_r);
    Vec_IntPush(p_02,iVar1);
    Entry = Entry + 1;
  }
  Gia_ManCleanMark01(p);
  iThis = 0;
  while (iVar1 = Vec_IntEntryLast(p_02), local_a0 < iVar1) {
    iVar1 = Vec_IntSize(p_00);
    Vec_IntPush(p_04,iVar1);
    iVar1 = Vec_IntSize(p_01);
    Vec_IntPush(p_05,iVar1);
    iVar1 = Vec_IntSize(p_02);
    Vec_IntPush(p_06,iVar1);
    iVar1 = Vec_IntSize(p_03);
    Vec_IntPush(p_07,iVar1);
    iVar1 = Vec_IntEntryLast(p_02);
    for (Entry = local_a0; Entry < iVar1; Entry = Entry + 1) {
      Vec_IntEntry(p_02,Entry);
      Gia_ManIncrementTravId(p);
      pGVar4 = Gia_ManObj(p,local_a0);
      iVar2 = Gia_ObjFaninId0(pGVar4,local_a0);
      Bmc_SuperBuildTents_rec(p,iVar2,p_00,p_01,p_02,p_03,p_08,p_09,iThis);
    }
    iThis = iThis + 1;
    local_a0 = iVar1;
  }
  Gia_ManCleanMark01(p);
  iVar1 = Vec_IntSize(p_00);
  Vec_IntPush(p_04,iVar1);
  iVar1 = Vec_IntSize(p_01);
  Vec_IntPush(p_05,iVar1);
  iVar1 = Vec_IntSize(p_02);
  Vec_IntPush(p_06,iVar1);
  iVar1 = Vec_IntSize(p_03);
  Vec_IntPush(p_07,iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_11 = Gia_ManStart(iVar1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_11->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_11->pSpec = pcVar5;
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  Entry = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00);
    bVar7 = false;
    if (Entry < iVar1) {
      iVar1 = Vec_IntEntry(p_00,Entry);
      _r = Gia_ManObj(p,iVar1);
      bVar7 = _r != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCi(p_11);
    _r->Value = uVar3;
    Entry = Entry + 1;
  }
  Entry = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_01);
    bVar7 = false;
    if (Entry < iVar1) {
      iVar1 = Vec_IntEntry(p_01,Entry);
      _r = Gia_ManObj(p,iVar1);
      bVar7 = _r != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCi(p_11);
    _r->Value = uVar3;
    Entry = Entry + 1;
  }
  for (Rank = iThis; -1 < Rank; Rank = Rank + -1) {
    for (Entry = Vec_IntEntry(p_06,Rank); iVar1 = Vec_IntEntry(p_06,Rank + 1), Entry < iVar1;
        Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p_02,Entry);
      _r = Gia_ManObj(p,iVar1);
      uVar3 = Gia_ObjFanin0Copy(_r);
      _r->Value = uVar3;
    }
    for (Entry = Vec_IntEntry(p_07,Rank); iVar1 = Vec_IntEntry(p_07,Rank + 1), Entry < iVar1;
        Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p_03,Entry);
      _r = Gia_ManObj(p,iVar1);
      uVar3 = Gia_ObjFanin0Copy(_r);
      _r->Value = uVar3;
    }
  }
  Entry = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar7 = false;
    if (Entry < iVar1) {
      _r = Gia_ManCo(p,Entry);
      bVar7 = _r != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(_r);
    Gia_ManAppendCo(p_11,iVar1);
    Entry = Entry + 1;
  }
  Entry = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_01);
    bVar7 = false;
    if (Entry < iVar1) {
      iVar1 = Vec_IntEntry(p_01,Entry);
      _r = Gia_ManObj(p,iVar1);
      bVar7 = _r != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(_r);
    Gia_ManAppendCo(p_11,iVar1);
    Entry = Entry + 1;
  }
  iVar1 = Vec_IntSize(p_01);
  Gia_ManSetRegNum(p_11,iVar1);
  for (Entry = 0; iVar1 = Vec_IntSize(p_00), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(p_00,Entry);
    iVar2 = Vec_IntEntry(p_08,Entry);
    Vec_IntPushTwo(p_10,iVar1,iVar2);
  }
  for (Entry = 0; iVar1 = Vec_IntSize(p_01), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(p_01,Entry);
    iVar2 = Vec_IntEntry(p_09,Entry);
    Vec_IntPushTwo(p_10,iVar1,iVar2);
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree(p_04);
  Vec_IntFree(p_05);
  Vec_IntFree(p_06);
  Vec_IntFree(p_07);
  Vec_IntFree(p_08);
  Vec_IntFree(p_09);
  if (pvMap == (Vec_Int_t **)0x0) {
    Vec_IntFree(p_10);
  }
  else {
    *pvMap = p_10;
  }
  pGVar6 = Gia_ManCleanup(p_11);
  Gia_ManStop(p_11);
  return pGVar6;
}

Assistant:

Gia_Man_t * Bmc_SuperBuildTents( Gia_Man_t * p, Vec_Int_t ** pvMap )
{
    Vec_Int_t * vIns      = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts     = Vec_IntAlloc( 1000 );
    Vec_Int_t * vFlops    = Vec_IntAlloc( 1000 );
    Vec_Int_t * vObjs     = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimIns   = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimCuts  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimFlops = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimObjs  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vRankIns  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vRankCuts = Vec_IntAlloc( 1000 );
    Vec_Int_t * vMap      = Vec_IntAlloc( 1000 );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, r, Entry, Rank, iPrev, iThis = 0;
    // collect internal nodes
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vFlops, Gia_ObjId(p, pObj) );
    Gia_ManCleanMark01( p );
    for ( Rank = 0; iThis < Vec_IntEntryLast(vFlops); Rank++ )
    {
        Vec_IntPush( vLimIns,   Vec_IntSize(vIns)   );
        Vec_IntPush( vLimCuts,  Vec_IntSize(vCuts)  );
        Vec_IntPush( vLimFlops, Vec_IntSize(vFlops) );
        Vec_IntPush( vLimObjs,  Vec_IntSize(vObjs)  );
        iPrev = iThis;
        iThis = Vec_IntEntryLast(vFlops);
        Vec_IntForEachEntryStartStop( vFlops, Entry, i, iPrev, iThis )
        {
            Gia_ManIncrementTravId( p );
            Bmc_SuperBuildTents_rec( p, Gia_ObjFaninId0(Gia_ManObj(p, iPrev), iPrev), vIns, vCuts, vFlops, vObjs, vRankIns, vRankCuts, Rank );
        }
    }
    Gia_ManCleanMark01( p );
    Vec_IntPush( vLimIns,   Vec_IntSize(vIns)   );
    Vec_IntPush( vLimCuts,  Vec_IntSize(vCuts)  );
    Vec_IntPush( vLimFlops, Vec_IntSize(vFlops) );
    Vec_IntPush( vLimObjs,  Vec_IntSize(vObjs)  );
    // create new GIA
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachObjVec( vCuts, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    for ( r = Rank; r >= 0; r-- )
    {
        Vec_IntForEachEntryStartStop( vFlops, Entry, i, Vec_IntEntry(vLimFlops, r), Vec_IntEntry(vLimFlops, r+1) )
        {
            pObj = Gia_ManObj(p, Entry);
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
        Vec_IntForEachEntryStartStop( vObjs, Entry, i, Vec_IntEntry(vLimObjs, r), Vec_IntEntry(vLimObjs, r+1) )
        {
            pObj = Gia_ManObj(p, Entry);
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
    }
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachObjVec( vCuts, p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vCuts) );

    // create map
    Vec_IntForEachEntryTwo( vIns, vRankIns, Entry, Rank, i )
        Vec_IntPushTwo( vMap, Entry, Rank );
    Vec_IntForEachEntryTwo( vCuts, vRankCuts, Entry, Rank, i )
        Vec_IntPushTwo( vMap, Entry, Rank );

    Vec_IntFree( vIns   );
    Vec_IntFree( vCuts  );
    Vec_IntFree( vFlops );
    Vec_IntFree( vObjs  );

    Vec_IntFree( vLimIns   );
    Vec_IntFree( vLimCuts  );
    Vec_IntFree( vLimFlops );
    Vec_IntFree( vLimObjs  );

    Vec_IntFree( vRankIns  );
    Vec_IntFree( vRankCuts  );

    if ( pvMap )
        *pvMap = vMap;
    else
        Vec_IntFree( vMap );

    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}